

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

bool httplib::detail::read_content_chunked(Stream *strm,ContentReceiverWithProgress *out)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  int extraout_var;
  ulong uVar4;
  char **ppcVar5;
  unsigned_long __args_1;
  int extraout_var_01;
  int extraout_var_02;
  int extraout_var_03;
  ulong uVar6;
  long lVar7;
  char *__s1;
  ulong __args_2;
  bool bVar8;
  char cVar9;
  bool bVar10;
  char *end_ptr;
  char buf [16];
  char byte;
  char *local_10e0;
  long local_10d8;
  ulong local_10d0;
  char *local_10c8;
  long local_10c0;
  char local_10b8;
  undefined7 uStack_10b7;
  undefined8 local_10a8;
  undefined8 uStack_10a0;
  code *local_1098;
  code *pcStack_1090;
  ContentReceiverWithProgress *local_1088;
  char *local_1080;
  ulong local_1078;
  ulong local_1070;
  _Any_data local_1068;
  code *local_1058;
  char local_1048 [16];
  char local_1038 [4104];
  int extraout_var_00;
  
  local_10e0 = local_1048;
  local_10d8 = 0x10;
  lVar7 = 0;
  local_10d0 = 0;
  local_10c8 = &local_10b8;
  local_10c0 = 0;
  local_10b8 = '\0';
  local_1088 = out;
  do {
    iVar3 = (*strm->_vptr_Stream[4])(strm,local_1038,1);
    uVar4 = local_10d0;
    if (extraout_var < 0) {
      bVar8 = false;
      bVar10 = false;
    }
    else if (CONCAT44(extraout_var,iVar3) == 0) {
      bVar10 = lVar7 != 0;
      bVar8 = false;
    }
    else {
      if (local_10d0 < local_10d8 - 1U) {
        local_10d0 = local_10d0 + 1;
        local_10e0[uVar4] = local_1038[0];
        local_10e0[local_10d0] = '\0';
      }
      else {
        if (local_10c0 == 0) {
          if (local_10e0[local_10d0] != '\0') goto LAB_0013aede;
          std::__cxx11::string::_M_replace((ulong)&local_10c8,0,(char *)0x0,(ulong)local_10e0);
        }
        std::__cxx11::string::push_back((char)&local_10c8);
      }
      bVar8 = local_1038[0] != '\n';
      bVar10 = true;
    }
    lVar7 = lVar7 + -1;
  } while (bVar8);
  if (bVar10) {
    do {
      ppcVar5 = &local_10c8;
      if (local_10c0 == 0) {
        ppcVar5 = &local_10e0;
      }
      uVar4 = strtoul(*ppcVar5,&local_1080,0x10);
      ppcVar5 = &local_10c8;
      if (local_10c0 == 0) {
        ppcVar5 = &local_10e0;
      }
      cVar9 = '\x01';
      if ((local_1080 != *ppcVar5) && (uVar4 != 0xffffffffffffffff)) {
        if (uVar4 == 0) {
          cVar9 = '\x03';
        }
        else {
          local_1098 = (code *)0x0;
          pcStack_1090 = (code *)0x0;
          local_10a8 = 0;
          uStack_10a0 = 0;
          std::function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)>::function
                    ((function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)> *)
                     &local_1068,local_1088);
          uVar6 = 0;
          do {
            __args_2 = uVar6;
            uVar6 = uVar4 - __args_2;
            if (uVar4 < __args_2 || uVar6 == 0) break;
            if (0xfff < uVar6) {
              uVar6 = 0x1000;
            }
            iVar3 = (*strm->_vptr_Stream[4])(strm,local_1038,uVar6);
            __args_1 = CONCAT44(extraout_var_00,iVar3);
            if ((__args_1 == 0 || extraout_var_00 < 0) ||
               (bVar8 = std::
                        function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)>::
                        operator()((function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)>
                                    *)&local_1068,local_1038,__args_1,__args_2,uVar4), !bVar8)) {
              bVar8 = false;
              uVar6 = __args_2;
            }
            else {
              uVar6 = __args_1 + __args_2;
              if ((local_1098 == (code *)0x0) ||
                 (local_1078 = uVar4, local_1070 = uVar6,
                 cVar2 = (*pcStack_1090)(&local_10a8,&local_1070,&local_1078), cVar2 != '\0')) {
                bVar8 = true;
              }
              else {
                bVar8 = false;
              }
            }
          } while (bVar8);
          if (local_1058 != (code *)0x0) {
            (*local_1058)(&local_1068,&local_1068,__destroy_functor);
          }
          if (local_1098 != (code *)0x0) {
            (*local_1098)(&local_10a8,&local_10a8,3);
          }
          if (uVar4 <= __args_2) {
            local_10d0 = 0;
            local_10c0 = 0;
            *local_10c8 = '\0';
            lVar7 = 0;
            do {
              iVar3 = (*strm->_vptr_Stream[4])(strm,local_1038,1);
              uVar6 = local_10d0;
              if (extraout_var_01 < 0) {
                bVar10 = false;
                bVar8 = false;
              }
              else if (CONCAT44(extraout_var_01,iVar3) == 0) {
                bVar8 = lVar7 != 0;
                bVar10 = false;
              }
              else {
                if (local_10d0 < local_10d8 - 1U) {
                  local_10d0 = local_10d0 + 1;
                  local_10e0[uVar6] = local_1038[0];
                  local_10e0[local_10d0] = '\0';
                }
                else {
                  if (local_10c0 == 0) {
                    if (local_10e0[local_10d0] != '\0') goto LAB_0013aede;
                    std::__cxx11::string::_M_replace
                              ((ulong)&local_10c8,0,(char *)0x0,(ulong)local_10e0);
                  }
                  std::__cxx11::string::push_back((char)&local_10c8);
                }
                bVar10 = local_1038[0] != '\n';
                bVar8 = true;
              }
              pcVar1 = local_10c8;
              lVar7 = lVar7 + -1;
            } while (bVar10);
            if (bVar8) {
              __s1 = local_10c8;
              if (local_10c0 == 0) {
                __s1 = local_10e0;
              }
              iVar3 = strcmp(__s1,"\r\n");
              cVar9 = '\x03';
              if (iVar3 == 0) {
                local_10d0 = 0;
                local_10c0 = 0;
                *pcVar1 = '\0';
                lVar7 = 0;
                do {
                  iVar3 = (*strm->_vptr_Stream[4])(strm,local_1038,1);
                  uVar6 = local_10d0;
                  if (extraout_var_02 < 0) {
                    cVar9 = true;
LAB_0013ad50:
                    bVar8 = false;
                  }
                  else {
                    if (CONCAT44(extraout_var_02,iVar3) == 0) {
                      cVar9 = lVar7 == 0;
                      goto LAB_0013ad50;
                    }
                    if (local_10d0 < local_10d8 - 1U) {
                      local_10d0 = local_10d0 + 1;
                      local_10e0[uVar6] = local_1038[0];
                      local_10e0[local_10d0] = '\0';
                    }
                    else {
                      if (local_10c0 == 0) {
                        if (local_10e0[local_10d0] != '\0') goto LAB_0013aede;
                        std::__cxx11::string::_M_replace
                                  ((ulong)&local_10c8,0,(char *)0x0,(ulong)local_10e0);
                      }
                      std::__cxx11::string::push_back((char)&local_10c8);
                    }
                    bVar8 = local_1038[0] != '\n';
                    cVar9 = false;
                  }
                  lVar7 = lVar7 + -1;
                } while (bVar8);
              }
            }
          }
        }
      }
    } while (cVar9 == '\0');
    if (cVar9 == '\x03') {
      if (uVar4 != 0) {
LAB_0013adb1:
        bVar8 = true;
        goto LAB_0013aeae;
      }
      lVar7 = 0;
      local_10d0 = 0;
      local_10c0 = 0;
      *local_10c8 = '\0';
      do {
        iVar3 = (*strm->_vptr_Stream[4])(strm,local_1038,1);
        uVar4 = local_10d0;
        if (extraout_var_03 < 0) {
          bVar8 = false;
          bVar10 = false;
        }
        else if (CONCAT44(extraout_var_03,iVar3) == 0) {
          bVar10 = lVar7 != 0;
          bVar8 = false;
        }
        else {
          if (local_10d0 < local_10d8 - 1U) {
            local_10d0 = local_10d0 + 1;
            local_10e0[uVar4] = local_1038[0];
            local_10e0[local_10d0] = '\0';
          }
          else {
            if (local_10c0 == 0) {
              if (local_10e0[local_10d0] != '\0') {
LAB_0013aede:
                __assert_fail("fixed_buffer_[fixed_buffer_used_size_] == \'\\0\'",
                              "/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/vendor/cpp-httplib/httplib.h"
                              ,0x8a8,"void httplib::detail::stream_line_reader::append(char)");
              }
              std::__cxx11::string::_M_replace((ulong)&local_10c8,0,(char *)0x0,(ulong)local_10e0);
            }
            std::__cxx11::string::push_back((char)&local_10c8);
          }
          bVar8 = local_1038[0] != '\n';
          bVar10 = true;
        }
        lVar7 = lVar7 + -1;
      } while (bVar8);
      if (bVar10) {
        ppcVar5 = &local_10c8;
        if (local_10c0 == 0) {
          ppcVar5 = &local_10e0;
        }
        iVar3 = strcmp(*ppcVar5,"\r\n");
        if (iVar3 == 0) goto LAB_0013adb1;
      }
    }
  }
  bVar8 = false;
LAB_0013aeae:
  if (local_10c8 != &local_10b8) {
    operator_delete(local_10c8,CONCAT71(uStack_10b7,local_10b8) + 1);
  }
  return bVar8;
}

Assistant:

inline bool read_content_chunked(Stream &strm,
                                 ContentReceiverWithProgress out) {
  const auto bufsiz = 16;
  char buf[bufsiz];

  stream_line_reader line_reader(strm, buf, bufsiz);

  if (!line_reader.getline()) { return false; }

  unsigned long chunk_len;
  while (true) {
    char *end_ptr;

    chunk_len = std::strtoul(line_reader.ptr(), &end_ptr, 16);

    if (end_ptr == line_reader.ptr()) { return false; }
    if (chunk_len == ULONG_MAX) { return false; }

    if (chunk_len == 0) { break; }

    if (!read_content_with_length(strm, chunk_len, nullptr, out)) {
      return false;
    }

    if (!line_reader.getline()) { return false; }

    if (strcmp(line_reader.ptr(), "\r\n")) { break; }

    if (!line_reader.getline()) { return false; }
  }

  if (chunk_len == 0) {
    // Reader terminator after chunks
    if (!line_reader.getline() || strcmp(line_reader.ptr(), "\r\n"))
      return false;
  }

  return true;
}